

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

bool __thiscall hdc::Lex::isOperator(Lex *this)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (this->buffer)._M_dataplus._M_p[this->idx];
  uVar2 = bVar1 - 0x21;
  if (((0x3d < uVar2) || ((0x34000000fe007fb9U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
     (3 < bVar1 - 0x7b)) {
    return false;
  }
  return true;
}

Assistant:

bool Lex::isOperator() {
    char c = buffer[idx];

    return c == '(' || c == ')' || c == '[' || c == ']'
        || c == '{' || c == '}' || c == '+' || c == '-'
        || c == '*' || c == '/' || c == '%' || c == '!'
        || c == '&' || c == '|' || c == '~' || c ==  '='
        || c == '>' || c == '<' || c == '^' || c == '.'
        || c == '$' || c == ':' || c == '?' || c == '@'
        || c == ',' || c == ';'; 
}